

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O0

double msen(jas_matrix_t *x,jas_matrix_t *y,int n)

{
  jas_matind_t jVar1;
  jas_seqent_t jVar2;
  jas_seqent_t jVar3;
  jas_matind_t jVar4;
  double dVar5;
  undefined8 local_40;
  jas_matind_t j;
  jas_matind_t i;
  double d;
  double s;
  int n_local;
  jas_matrix_t *y_local;
  jas_matrix_t *x_local;
  
  d = 0.0;
  j = 0;
  do {
    jVar1 = jas_matrix_numrows(x);
    if (jVar1 <= j) {
      jVar1 = jas_matrix_numrows(x);
      jVar4 = jas_matrix_numcols(x);
      return d / ((double)jVar1 * (double)jVar4);
    }
    local_40 = 0;
    while( true ) {
      jVar1 = jas_matrix_numcols(x);
      if (jVar1 <= local_40) break;
      jVar2 = jas_matrix_get(y,j,local_40);
      jVar3 = jas_matrix_get(x,j,local_40);
      dVar5 = (double)(jVar2 - jVar3);
      if (n == 1) {
        dVar5 = ABS(dVar5);
      }
      else {
        if (n != 2) {
          abort();
        }
        dVar5 = dVar5 * dVar5;
      }
      d = dVar5 + d;
      local_40 = local_40 + 1;
    }
    j = j + 1;
  } while( true );
}

Assistant:

double msen(jas_matrix_t *x, jas_matrix_t *y, int n)
{
	double s;
	double d;

	s = 0.0;
	for (jas_matind_t i = 0; i < jas_matrix_numrows(x); i++) {
		for (jas_matind_t j = 0; j < jas_matrix_numcols(x); j++) {
			d = jas_matrix_get(y, i, j) - jas_matrix_get(x, i, j);
			if (n == 1) {
				s += fabs(d);
			} else if (n == 2) {
				s += d * d;
			} else {
				abort();
			}
		}
	}

	return s / ((double) jas_matrix_numrows(x) * jas_matrix_numcols(x));
}